

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl3cCommonBugsTests.cpp
# Opt level: O3

string * __thiscall
gl3cts::PerVertexValidationTest::getVertexShaderBody
          (string *__return_storage_ptr__,PerVertexValidationTest *this,ContextType context_type,
          _test_iteration iteration,string *main_body)

{
  bool bVar1;
  char *pcVar2;
  char *pcVar3;
  char *pcVar4;
  ostream *poVar5;
  long lVar6;
  long lVar7;
  char *pcVar8;
  long lVar9;
  long lVar10;
  char *pcVar11;
  bool bVar12;
  bool bVar13;
  bool bVar14;
  stringstream vs_body_sstream;
  stringstream local_1b8 [16];
  undefined1 local_1a8 [376];
  
  bVar12 = (iteration << 0x1e | iteration >> 2) < 6;
  pcVar11 = glcts::fixed_sample_locations_values + 1;
  pcVar2 = "float gl_ClipDistance[];\n";
  if (iteration == TEST_ITERATION_UNDECLARED_OUT_PERVERTEX_VS_GL_CLIPDISTANCE_USAGE || bVar12) {
    pcVar2 = glcts::fixed_sample_locations_values + 1;
  }
  if (((iteration - TEST_ITERATION_UNDECLARED_IN_PERVERTEX_GS_GL_CULLDISTANCE_USAGE) * 0x40000000 |
      iteration - TEST_ITERATION_UNDECLARED_IN_PERVERTEX_GS_GL_CULLDISTANCE_USAGE >> 2) < 7) {
    bVar1 = false;
  }
  else {
    bVar1 = glu::contextSupports(context_type,(ApiType)0x154);
  }
  bVar13 = ((iteration - TEST_ITERATION_UNDECLARED_IN_PERVERTEX_GS_GL_POINTSIZE_USAGE) * 0x40000000
           | iteration - TEST_ITERATION_UNDECLARED_IN_PERVERTEX_GS_GL_POINTSIZE_USAGE >> 2) < 6;
  pcVar3 = "float gl_PointSize;\n";
  if (iteration == TEST_ITERATION_UNDECLARED_OUT_PERVERTEX_VS_GL_POINTSIZE_USAGE || bVar13) {
    pcVar3 = glcts::fixed_sample_locations_values + 1;
  }
  bVar14 = ((iteration - TEST_ITERATION_UNDECLARED_IN_PERVERTEX_GS_GL_POSITION_USAGE) * 0x40000000 |
           iteration - TEST_ITERATION_UNDECLARED_IN_PERVERTEX_GS_GL_POSITION_USAGE >> 2) < 6;
  pcVar4 = "vec4  gl_Position;\n";
  if (iteration == TEST_ITERATION_UNDECLARED_OUT_PERVERTEX_VS_GL_POSITION_USAGE || bVar14) {
    pcVar4 = glcts::fixed_sample_locations_values + 1;
  }
  std::__cxx11::stringstream::stringstream(local_1b8);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"#version ",9);
  pcVar8 = "320";
  if (bVar1 != false) {
    pcVar8 = "450";
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,pcVar8,3);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,"\n\nin gl_PerVertex\n{\n",0x14);
  lVar10 = 0x19;
  if (iteration == TEST_ITERATION_UNDECLARED_OUT_PERVERTEX_VS_GL_CLIPDISTANCE_USAGE || bVar12) {
    lVar10 = 0;
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,pcVar2,lVar10);
  lVar9 = 0x14;
  if (iteration == TEST_ITERATION_UNDECLARED_OUT_PERVERTEX_VS_GL_POINTSIZE_USAGE || bVar13) {
    lVar9 = 0;
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,pcVar3,lVar9);
  lVar7 = 0x13;
  if (iteration == TEST_ITERATION_UNDECLARED_OUT_PERVERTEX_VS_GL_POSITION_USAGE || bVar14) {
    lVar7 = 0;
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,pcVar4,lVar7);
  if (bVar1 != false) {
    pcVar11 = "float gl_CullDistance[];\n";
  }
  lVar6 = 0x19;
  if (bVar1 == false) {
    lVar6 = 0;
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,pcVar11,lVar6);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,"};\n\nout gl_PerVertex\n{\n",0x17);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,pcVar2,lVar10);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,pcVar3,lVar9);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,pcVar4,lVar7);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,pcVar11,lVar6);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,"};\n\nvoid main()\n{\n    ",0x16);
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)local_1a8,(main_body->_M_dataplus)._M_p,main_body->_M_string_length
                     );
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\n}\n",3);
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1b8);
  std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x70));
  return __return_storage_ptr__;
}

Assistant:

std::string PerVertexValidationTest::getVertexShaderBody(glu::ContextType context_type, _test_iteration iteration,
														 std::string main_body) const
{
	const bool include_clip_distance = (iteration != TEST_ITERATION_UNDECLARED_IN_PERVERTEX_GS_GL_CLIPDISTANCE_USAGE &&
										iteration != TEST_ITERATION_UNDECLARED_IN_PERVERTEX_TC_GL_CLIPDISTANCE_USAGE &&
										iteration != TEST_ITERATION_UNDECLARED_IN_PERVERTEX_TE_GL_CLIPDISTANCE_USAGE &&
										iteration != TEST_ITERATION_UNDECLARED_OUT_PERVERTEX_GS_GL_CLIPDISTANCE_USAGE &&
										iteration != TEST_ITERATION_UNDECLARED_OUT_PERVERTEX_TC_GL_CLIPDISTANCE_USAGE &&
										iteration != TEST_ITERATION_UNDECLARED_OUT_PERVERTEX_TE_GL_CLIPDISTANCE_USAGE &&
										iteration != TEST_ITERATION_UNDECLARED_OUT_PERVERTEX_VS_GL_CLIPDISTANCE_USAGE);
	const bool include_cull_distance = (iteration != TEST_ITERATION_UNDECLARED_IN_PERVERTEX_GS_GL_CULLDISTANCE_USAGE &&
										iteration != TEST_ITERATION_UNDECLARED_IN_PERVERTEX_TC_GL_CULLDISTANCE_USAGE &&
										iteration != TEST_ITERATION_UNDECLARED_IN_PERVERTEX_TE_GL_CULLDISTANCE_USAGE &&
										iteration != TEST_ITERATION_UNDECLARED_OUT_PERVERTEX_GS_GL_CULLDISTANCE_USAGE &&
										iteration != TEST_ITERATION_UNDECLARED_OUT_PERVERTEX_TC_GL_CULLDISTANCE_USAGE &&
										iteration != TEST_ITERATION_UNDECLARED_OUT_PERVERTEX_TE_GL_CULLDISTANCE_USAGE &&
										iteration != TEST_ITERATION_UNDECLARED_OUT_PERVERTEX_VS_GL_CULLDISTANCE_USAGE &&
										glu::contextSupports(context_type, glu::ApiType::core(4, 5)));
	const bool include_pointsize = (iteration != TEST_ITERATION_UNDECLARED_IN_PERVERTEX_GS_GL_POINTSIZE_USAGE &&
									iteration != TEST_ITERATION_UNDECLARED_IN_PERVERTEX_TC_GL_POINTSIZE_USAGE &&
									iteration != TEST_ITERATION_UNDECLARED_IN_PERVERTEX_TE_GL_POINTSIZE_USAGE &&
									iteration != TEST_ITERATION_UNDECLARED_OUT_PERVERTEX_GS_GL_POINTSIZE_USAGE &&
									iteration != TEST_ITERATION_UNDECLARED_OUT_PERVERTEX_TC_GL_POINTSIZE_USAGE &&
									iteration != TEST_ITERATION_UNDECLARED_OUT_PERVERTEX_TE_GL_POINTSIZE_USAGE &&
									iteration != TEST_ITERATION_UNDECLARED_OUT_PERVERTEX_VS_GL_POINTSIZE_USAGE);
	const bool include_position = (iteration != TEST_ITERATION_UNDECLARED_IN_PERVERTEX_GS_GL_POSITION_USAGE &&
								   iteration != TEST_ITERATION_UNDECLARED_IN_PERVERTEX_TC_GL_POSITION_USAGE &&
								   iteration != TEST_ITERATION_UNDECLARED_IN_PERVERTEX_TE_GL_POSITION_USAGE &&
								   iteration != TEST_ITERATION_UNDECLARED_OUT_PERVERTEX_GS_GL_POSITION_USAGE &&
								   iteration != TEST_ITERATION_UNDECLARED_OUT_PERVERTEX_TC_GL_POSITION_USAGE &&
								   iteration != TEST_ITERATION_UNDECLARED_OUT_PERVERTEX_TE_GL_POSITION_USAGE &&
								   iteration != TEST_ITERATION_UNDECLARED_OUT_PERVERTEX_VS_GL_POSITION_USAGE);
	std::stringstream vs_body_sstream;

	vs_body_sstream << "#version " << ((include_cull_distance) ? "450" : "320") << "\n"
																				   "\n"
																				   "in gl_PerVertex\n"
																				   "{\n";

	vs_body_sstream << ((include_clip_distance) ? "float gl_ClipDistance[];\n" : "");
	vs_body_sstream << ((include_pointsize) ? "float gl_PointSize;\n" : "");
	vs_body_sstream << ((include_position) ? "vec4  gl_Position;\n" : "");
	vs_body_sstream << ((include_cull_distance) ? "float gl_CullDistance[];\n" : "");

	vs_body_sstream << "};\n"
					   "\n"
					   "out gl_PerVertex\n"
					   "{\n";

	vs_body_sstream << ((include_clip_distance) ? "float gl_ClipDistance[];\n" : "");
	vs_body_sstream << ((include_pointsize) ? "float gl_PointSize;\n" : "");
	vs_body_sstream << ((include_position) ? "vec4  gl_Position;\n" : "");
	vs_body_sstream << ((include_cull_distance) ? "float gl_CullDistance[];\n" : "");

	vs_body_sstream << "};\n"
					   "\n"
					   "void main()\n"
					   "{\n"
					   "    "
					<< main_body << "\n"
									"}\n";

	return vs_body_sstream.str();
}